

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue2i
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,GLint x,
               GLint y)

{
  ostringstream *this;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[2]> state;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetUniformiv(gl,program,location,state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&state,testCtx);
  if ((bVar1) && ((state.m_value[0] != 1 || (state.m_value[1] != x)))) {
    local_1b0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected [");
    std::ostream::operator<<(this,1);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,"]; got [");
    std::ostream::operator<<(this,state.m_value[0]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,state.m_value[1]);
    std::operator<<((ostream *)this,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue2i (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, GLint x, GLint y)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[2]> state;
	gl.glGetUniformiv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y
		<< "]; got ["
		<< state[0] << ", "
		<< state[1]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}